

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

Type * __thiscall
soul::heart::IODeclaration::getSampleArrayType
          (Type *__return_storage_ptr__,IODeclaration *this,Type *t)

{
  Structure *pSVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  PrimitiveType PVar5;
  BoundedIntSize BVar6;
  
  if ((this->arraySize).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    Type::createArray(__return_storage_ptr__,t,
                      (ulong)(this->arraySize).super__Optional_base<unsigned_int,_true,_true>.
                             _M_payload.super__Optional_payload_base<unsigned_int>._M_payload.
                             _M_value);
  }
  else {
    CVar2 = t->arrayElementCategory;
    bVar3 = t->isRef;
    bVar4 = t->isConstant;
    PVar5.type = (t->primitiveType).type;
    __return_storage_ptr__->category = t->category;
    __return_storage_ptr__->arrayElementCategory = CVar2;
    __return_storage_ptr__->isRef = bVar3;
    __return_storage_ptr__->isConstant = bVar4;
    __return_storage_ptr__->primitiveType = (PrimitiveType)PVar5.type;
    BVar6 = t->arrayElementBoundingSize;
    __return_storage_ptr__->boundingSize = t->boundingSize;
    __return_storage_ptr__->arrayElementBoundingSize = BVar6;
    pSVar1 = (t->structure).object;
    (__return_storage_ptr__->structure).object = pSVar1;
    if (pSVar1 != (Structure *)0x0) {
      (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Type getSampleArrayType (Type t) const
        {
            return arraySize.has_value() ? t.createArray (*arraySize) : t;
        }